

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EulerAngles.cpp
# Opt level: O0

EulerAngles * __thiscall
KDIS::DATA_TYPE::EulerAngles::operator-=(EulerAngles *this,EulerAngles *Value)

{
  EulerAngles *Value_local;
  EulerAngles *this_local;
  
  this->m_f32Psi = (KFLOAT32)((float)this->m_f32Psi - (float)Value->m_f32Psi);
  this->m_f32Theta = (KFLOAT32)((float)this->m_f32Theta - (float)Value->m_f32Theta);
  this->m_f32Phi = (KFLOAT32)((float)this->m_f32Phi - (float)Value->m_f32Phi);
  return this;
}

Assistant:

EulerAngles & EulerAngles::operator -= ( const EulerAngles & Value )
{
    m_f32Psi   -= Value.m_f32Psi;
    m_f32Theta -= Value.m_f32Theta;
    m_f32Phi   -= Value.m_f32Phi;
    return *this;
}